

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

cupdlp_int cupdlp_dot(CUPDLPwork *w,cupdlp_int n,cupdlp_float *x,cupdlp_float *y,cupdlp_float *res)

{
  double dVar1;
  
  dVar1 = dot(n,x,(cupdlp_int)x,y,(cupdlp_int)res);
  *res = dVar1;
  return 0;
}

Assistant:

cupdlp_int cupdlp_dot(CUPDLPwork *w, const cupdlp_int n, const cupdlp_float *x,
                      const cupdlp_float *y, cupdlp_float *res) {
#ifndef CUPDLP_CPU
#ifndef SFLOAT
  CHECK_CUBLAS(cublasDdot(w->cublashandle, n, x, 1, y, 1, res));
#else
  CHECK_CUBLAS(cublasSdot(w->cublashandle, n, x, 1, y, 1 res));
#endif
#else
  *res = dot(n, x, 1, y, 1);
#endif
  return 0;
}